

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O1

void __thiscall
HintSource::HintSource
          (HintSource *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *text_ids,
          string *description,WorldNode *node,bool small_textbox,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *map_ids,Position position,
          uint8_t orientation,bool high_palette)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  
  this->_vptr_HintSource = (_func_int **)&PTR_to_json_abi_cxx11__002615c0;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->_text_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (text_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(this->_description).field_2;
  (this->_description)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (description->_M_dataplus)._M_p;
  paVar2 = &description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&description->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_description).field_2 + 8) = uVar4;
  }
  else {
    (this->_description)._M_dataplus._M_p = pcVar3;
    (this->_description).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_description)._M_string_length = description->_M_string_length;
  (description->_M_dataplus)._M_p = (pointer)paVar2;
  description->_M_string_length = 0;
  (description->field_2)._M_local_buf[0] = '\0';
  this->_node = node;
  this->_small_textbox = small_textbox;
  (this->_text)._M_dataplus._M_p = (pointer)&(this->_text).field_2;
  (this->_text)._M_string_length = 0;
  (this->_text).field_2._M_local_buf[0] = '\0';
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->_map_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (map_ids->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_position).half_y = (bool)(char)position._4_2_;
  (this->_position).half_z = (bool)(char)((ushort)position._4_2_ >> 8);
  uVar5 = position._0_4_;
  (this->_position).x = (char)uVar5;
  (this->_position).y = (char)((uint)uVar5 >> 8);
  (this->_position).z = (char)((uint)uVar5 >> 0x10);
  (this->_position).half_x = (bool)(char)((uint)uVar5 >> 0x18);
  this->_orientation = orientation;
  this->_high_palette = high_palette;
  return;
}

Assistant:

HintSource::HintSource(std::vector<uint16_t> text_ids, std::string description,
        WorldNode* node, bool small_textbox,
        std::vector<uint16_t> map_ids, Position position, uint8_t orientation, bool high_palette) :
    _text_ids       (std::move(text_ids)),
    _description    (std::move(description)),
    _node           (node),
    _small_textbox  (small_textbox),
    _map_ids        (std::move(map_ids)),
    _position       (position),
    _orientation    (orientation),
    _high_palette   (high_palette)
{}